

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

uint64_t do_ats_write(CPUARMState_conflict *env,uint64_t value,MMUAccessType access_type,
                     ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  uint32_t target_el;
  uint32_t value_00;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  uint64_t uVar9;
  ulong uVar10;
  bool bVar11;
  MemTxAttrs attrs;
  hwaddr phys_addr;
  ARMCacheAttrs cacheattrs;
  ARMMMUFaultInfo_conflict1 fi;
  target_ulong page_size;
  int prot;
  
  attrs = (MemTxAttrs)0x0;
  fi.level = 0;
  fi.domain = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_5_ = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  cacheattrs = (ARMCacheAttrs)0x0;
  _Var1 = get_phys_addr_aarch64
                    (env,value,access_type,mmu_idx,&phys_addr,&attrs,&prot,&page_size,&fi,
                     &cacheattrs);
  if (!_Var1) {
LAB_005aebaa:
    if (env->aarch64 != 0) goto LAB_005aebb3;
    if ((env->features & 0x4000000) != 0) {
      _Var3 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx);
      if ((env->features & 0x100000000) == 0) {
        if (_Var3) {
LAB_005aebb3:
          if (!_Var1) {
            return (ulong)((ushort)cacheattrs._0_2_ >> 1 & 0x180) |
                   (ulong)(ushort)cacheattrs._0_2_ << 0x38 |
                   (ulong)(((uint)attrs & 2) == 0) << 9 |
                   CONCAT44(phys_addr._4_4_,(uint)phys_addr) & 0xfffffffffffff000 | 0x800;
          }
          uVar4 = arm_fi_to_lfsc(&fi);
          uVar8 = (ulong)((uVar4 & 0x3f) * 2 + 0x801);
          uVar10 = uVar8 + 0x200;
          if (fi.stage2 == false) {
            uVar10 = uVar8;
          }
          if (fi.s1ptw != false) {
            return uVar10 + 0x100;
          }
          return uVar10;
        }
      }
      else {
        if ((mmu_idx < ARMMMUIdx_E2) && ((0xd0000U >> (mmu_idx & 0x1f) & 1) != 0)) {
          bVar11 = ((env->cp15).hcr_el2 & 0x1001) != 0;
        }
        else {
          iVar5 = arm_current_el(env);
          bVar11 = iVar5 == 2;
        }
        if (_Var3 || bVar11) goto LAB_005aebb3;
      }
    }
    if (_Var1) {
      uVar4 = arm_fi_to_sfsc(&fi);
      uVar8 = (ulong)((uVar4 >> 6 & 0x40 | uVar4 >> 5 & 0x20) + (uVar4 & 0xf) * 2 + 1);
    }
    else {
      if ((page_size == 0x1000000) && ((env->features & 0x20) != 0)) {
        uVar10 = (ulong)phys_addr._3_1_ << 0x18 | 2;
      }
      else {
        uVar10 = (ulong)((uint)phys_addr & 0xfffff000);
      }
      uVar8 = uVar10 | 0x200;
      if (((uint)attrs & 2) != 0) {
        uVar8 = uVar10;
      }
    }
    return uVar8;
  }
  uVar4 = arm_current_el(env);
  _Var3 = fi.s1ptw;
  if (((uVar4 == 1 & fi.s1ptw) != 1) ||
     (_Var2 = arm_is_secure(env), mmu_idx + ~ARMMMUIdx_Stage1_E1_PAN < 0xfffffffd || _Var2)) {
    if (fi.type != ARMFault_SyncExternalOnWalk) goto LAB_005aebaa;
    if (fi.stage2 == true) {
      if (uVar4 != 3) goto LAB_005aedae;
LAB_005aedb4:
      target_el = 3;
    }
    else {
      iVar5 = arm_current_el(env);
      if (iVar5 < 1) {
        target_el = 1;
      }
      else {
        target_el = arm_current_el(env);
      }
      _Var1 = arm_is_secure(env);
      if ((_Var1) &&
         ((byte)(target_el != 1 | (*(byte *)((long)&env->features + 3) & 0x10) >> 4) != 1))
      goto LAB_005aedb4;
      if (target_el == 2) goto LAB_005aedae;
    }
    _Var1 = arm_el_is_aa64(env,target_el);
    if ((!_Var1) && (_Var1 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx), !_Var1)) {
      value_00 = arm_fi_to_sfsc(&fi);
      uVar7 = 0x9200017f;
      goto LAB_005aedf4;
    }
  }
  else {
    if ((fi.type == ARMFault_SyncExternalOnWalk) && (((env->cp15).scr_el3 & 8) != 0))
    goto LAB_005aedb4;
    uVar9 = extract64(fi.s2addr,0xc,0x2f);
    (env->cp15).hpfar_el2 = uVar9 << 4;
LAB_005aedae:
    target_el = 2;
  }
  value_00 = arm_fi_to_lfsc(&fi);
  uVar6 = extract32(value_00,0,6);
  uVar7 = uVar6 | 0x92000140;
LAB_005aedf4:
  (env->exception).vaddress = value;
  (env->exception).fsr = value_00;
  raise_exception_aarch64
            (env,4,(uint)_Var3 << 7 | (uint)fi.ea << 9 | (uint)(uVar4 == target_el) << 0x1a | uVar7,
             target_el);
}

Assistant:

static uint64_t do_ats_write(CPUARMState *env, uint64_t value,
                             MMUAccessType access_type, ARMMMUIdx mmu_idx)
{
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    uint64_t par64;
    bool format64 = false;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };
    ARMCacheAttrs cacheattrs = { 0 };

    ret = get_phys_addr(env, value, access_type, mmu_idx, &phys_addr, &attrs,
                        &prot, &page_size, &fi, &cacheattrs);

    if (ret) {
        /*
         * Some kinds of translation fault must cause exceptions rather
         * than being reported in the PAR.
         */
        int current_el = arm_current_el(env);
        int target_el;
        uint32_t syn, fsr, fsc;
        bool take_exc = false;

        if (fi.s1ptw && current_el == 1 && !arm_is_secure(env)
            && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
            /*
             * Synchronous stage 2 fault on an access made as part of the
             * translation table walk for AT S1E0* or AT S1E1* insn
             * executed from NS EL1. If this is a synchronous external abort
             * and SCR_EL3.EA == 1, then we take a synchronous external abort
             * to EL3. Otherwise the fault is taken as an exception to EL2,
             * and HPFAR_EL2 holds the faulting IPA.
             */
            if (fi.type == ARMFault_SyncExternalOnWalk &&
                (env->cp15.scr_el3 & SCR_EA)) {
                target_el = 3;
            } else {
                env->cp15.hpfar_el2 = extract64(fi.s2addr, 12, 47) << 4;
                target_el = 2;
            }
            take_exc = true;
        } else if (fi.type == ARMFault_SyncExternalOnWalk) {
            /*
             * Synchronous external aborts during a translation table walk
             * are taken as Data Abort exceptions.
             */
            if (fi.stage2) {
                if (current_el == 3) {
                    target_el = 3;
                } else {
                    target_el = 2;
                }
            } else {
                target_el = exception_target_el(env);
            }
            take_exc = true;
        }

        if (take_exc) {
            /* Construct FSR and FSC using same logic as arm_deliver_fault() */
            if (target_el == 2 || arm_el_is_aa64(env, target_el) ||
                arm_s1_regime_using_lpae_format(env, mmu_idx)) {
                fsr = arm_fi_to_lfsc(&fi);
                fsc = extract32(fsr, 0, 6);
            } else {
                fsr = arm_fi_to_sfsc(&fi);
                fsc = 0x3f;
            }
            /*
             * Report exception with ESR indicating a fault due to a
             * translation table walk for a cache maintenance instruction.
             */
            syn = syn_data_abort_no_iss(current_el == target_el,
                                        fi.ea, 1, fi.s1ptw, 1, fsc);
            env->exception.vaddress = value;
            env->exception.fsr = fsr;
            raise_exception(env, EXCP_DATA_ABORT, syn, target_el);
        }
    }

    if (is_a64(env)) {
        format64 = true;
    } else if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /*
         * ATS1Cxx:
         * * TTBCR.EAE determines whether the result is returned using the
         *   32-bit or the 64-bit PAR format
         * * Instructions executed in Hyp mode always use the 64bit format
         *
         * ATS1S2NSOxx uses the 64bit format if any of the following is true:
         * * The Non-secure TTBCR.EAE bit is set to 1
         * * The implementation includes EL2, and the value of HCR.VM is 1
         *
         * (Note that HCR.DC makes HCR.VM behave as if it is 1.)
         *
         * ATS1Hx always uses the 64bit format.
         */
        format64 = arm_s1_regime_using_lpae_format(env, mmu_idx);

        if (arm_feature(env, ARM_FEATURE_EL2)) {
            if (mmu_idx == ARMMMUIdx_E10_0 ||
                mmu_idx == ARMMMUIdx_E10_1 ||
                mmu_idx == ARMMMUIdx_E10_1_PAN) {
                format64 |= env->cp15.hcr_el2 & (HCR_VM | HCR_DC);
            } else {
                format64 |= arm_current_el(env) == 2;
            }
        }
    }

    if (format64) {
        /* Create a 64-bit PAR */
        par64 = (1 << 11); /* LPAE bit always set */
        if (!ret) {
            par64 |= phys_addr & ~0xfffULL;
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
            par64 |= (uint64_t)cacheattrs.attrs << 56; /* ATTR */
            par64 |= cacheattrs.shareability << 7; /* SH */
        } else {
            uint32_t fsr = arm_fi_to_lfsc(&fi);

            par64 |= 1; /* F */
            par64 |= (fsr & 0x3f) << 1; /* FS */
            if (fi.stage2) {
                par64 |= (1 << 9); /* S */
            }
            if (fi.s1ptw) {
                par64 |= (1 << 8); /* PTW */
            }
        }
    } else {
        /* fsr is a DFSR/IFSR value for the short descriptor
         * translation table format (with WnR always clear).
         * Convert it to a 32-bit PAR.
         */
        if (!ret) {
            /* We do not set any attribute bits in the PAR */
            if (page_size == (1 << 24)
                && arm_feature(env, ARM_FEATURE_V7)) {
                par64 = (phys_addr & 0xff000000) | (1 << 1);
            } else {
                par64 = phys_addr & 0xfffff000;
            }
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
        } else {
            uint32_t fsr = arm_fi_to_sfsc(&fi);

            par64 = ((fsr & (1 << 10)) >> 5) | ((fsr & (1 << 12)) >> 6) |
                    ((fsr & 0xf) << 1) | 1;
        }
    }
    return par64;
}